

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSingularFieldHasBits
          (MessageGenerator *this,FieldDescriptor *field,Formatter *format)

{
  bool bVar1;
  CppType CVar2;
  char *pcVar3;
  reference pvVar4;
  int __c;
  FieldDescriptor *in_RSI;
  undefined8 *in_RDI;
  int has_bit_index;
  Options *in_stack_fffffffffffffef8;
  Options *options;
  LogMessage *in_stack_ffffffffffffff00;
  allocator *field_00;
  LogMessage *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  Formatter *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  Formatter *in_stack_ffffffffffffff50;
  allocator local_91;
  string local_90 [55];
  byte local_59;
  undefined1 local_58 [60];
  int local_1c;
  FieldDescriptor *local_10;
  
  local_10 = in_RSI;
  FieldDescriptor::options(in_RSI);
  bVar1 = FieldOptions::weak((FieldOptions *)0x4f29a6);
  if (bVar1) {
    Formatter::operator()<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
  }
  else {
    Descriptor::file((Descriptor *)*in_RDI);
    bVar1 = HasFieldPresence((FileDescriptor *)0x4f29d7);
    if (bVar1) {
      pcVar3 = FieldDescriptor::index(local_10,(char *)in_RSI,__c);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x21),(long)(int)pcVar3);
      local_1c = *pvVar4;
      local_59 = 0;
      if (local_1c < 0) {
        internal::LogMessage::LogMessage
                  (in_stack_ffffffffffffff10,(LogLevel)((ulong)local_58 >> 0x20),
                   (char *)in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20)
                  );
        local_59 = 1;
        internal::LogMessage::operator<<
                  (in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8);
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_ffffffffffffff00,(LogMessage *)in_stack_fffffffffffffef8)
        ;
      }
      if ((local_59 & 1) != 0) {
        internal::LogMessage::~LogMessage((LogMessage *)0x4f2a9b);
      }
      field_00 = &local_91;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"has_array_index",field_00);
      Formatter::Set<int>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff30);
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      options = (Options *)&stack0xffffffffffffff47;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff48,"has_mask",(allocator *)options);
      strings::Hex::Hex<unsigned_int>
                ((Hex *)&stack0xffffffffffffff30,1 << ((byte)local_1c & 0x1f),ZERO_PAD_8);
      Formatter::Set<google::protobuf::strings::Hex>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                 (Hex *)in_stack_ffffffffffffff40);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff47);
      Formatter::operator()<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4f2ba6);
      if ((CVar2 == CPPTYPE_MESSAGE) &&
         (bVar1 = IsLazy((FieldDescriptor *)field_00,options), !bVar1)) {
        Formatter::operator()<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      }
      Formatter::operator()<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    }
    else {
      CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x4f2cbb);
      if (CVar2 == CPPTYPE_MESSAGE) {
        bVar1 = IsLazy((FieldDescriptor *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
        if (bVar1) {
          Formatter::operator()<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        }
        else {
          Formatter::operator()<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
        }
        Formatter::operator()<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      }
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSingularFieldHasBits(
    const FieldDescriptor* field, Formatter format) {
  if (field->options().weak()) {
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_accessor$"
        "  return _weak_field_map_.Has($number$);\n"
        "}\n");
    return;
  }
  if (HasFieldPresence(descriptor_->file())) {
    // N.B.: without field presence, we do not use has-bits or generate
    // has_$name$() methods.
    int has_bit_index = has_bit_indices_[field->index()];
    GOOGLE_CHECK_GE(has_bit_index, 0);

    format.Set("has_array_index", has_bit_index / 32);
    format.Set("has_mask",
               strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  bool value = "
        "(_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n");

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsLazy(field, options_)) {
      // We maintain the invariant that for a submessage x, has_x() returning
      // true implies that x_ is not null. By giving this information to the
      // compiler, we allow it to eliminate unnecessary null checks later on.
      format("  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
    }

    format(
        "  return value;\n"
        "}\n"
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_accessor$"
        "  return _internal_has_$name$();\n"
        "}\n");
  } else {
    // Message fields have a has_$name$() method.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (IsLazy(field, options_)) {
        format(
            "inline bool $classname$::_internal_has_$name$() const {\n"
            "  return !$name$_.IsCleared();\n"
            "}\n");
      } else {
        format(
            "inline bool $classname$::_internal_has_$name$() const {\n"
            "  return this != internal_default_instance() "
            "&& $name$_ != nullptr;\n"
            "}\n");
      }
      format(
          "inline bool $classname$::has_$name$() const {\n"
          "$annotate_accessor$"
          "  return _internal_has_$name$();\n"
          "}\n");
    }
  }
}